

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::RenderArrow(ImVec2 p_min,ImGuiDir dir,float scale)

{
  ImDrawList *this;
  ImU32 col;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  
  fVar7 = GImGui->FontSize * 0.5;
  fVar8 = fVar7 + p_min.x;
  fVar7 = fVar7 * scale + p_min.y;
  if (dir + 1U < 6) {
    fVar4 = GImGui->FontSize * 0.4 * scale;
    fVar1 = fVar4;
    switch(dir) {
    case 0:
      fVar1 = -fVar4;
    case 1:
      fVar8 = fVar8 + fVar1 * -0.25;
      fVar4 = fVar1 * 0.0;
      fVar2 = fVar1 * -0.5;
      fVar3 = fVar1 * 0.866;
      fVar5 = fVar1 * -0.866;
      fVar6 = fVar2;
      break;
    case 2:
      fVar4 = -fVar4;
    case 3:
      fVar7 = fVar4 * -0.25 + fVar7;
      fVar1 = fVar4 * 0.0;
      fVar2 = fVar4 * -0.866;
      fVar3 = fVar4 * -0.5;
      fVar6 = fVar4 * 0.866;
      fVar5 = fVar3;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x1159,"void ImGui::RenderArrow(ImVec2, ImGuiDir, float)");
    }
  }
  else {
    fVar2 = 0.0;
    fVar3 = 0.0;
    fVar1 = 0.0;
    fVar4 = 0.0;
    fVar6 = 0.0;
    fVar5 = 0.0;
  }
  this = GImGui->CurrentWindow->DrawList;
  local_28.y = fVar4 + fVar7;
  local_28.x = fVar1 + fVar8;
  local_30.y = fVar3 + fVar7;
  local_30.x = fVar2 + fVar8;
  local_38.y = fVar5 + fVar7;
  local_38.x = fVar6 + fVar8;
  col = GetColorU32(0,1.0);
  ImDrawList::AddTriangleFilled(this,&local_28,&local_30,&local_38,col);
  return;
}

Assistant:

void ImGui::RenderArrow(ImVec2 p_min, ImGuiDir dir, float scale)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const float h = g.FontSize * 1.00f;
    float r = h * 0.40f * scale;
    ImVec2 center = p_min + ImVec2(h * 0.50f, h * 0.50f * scale);

    ImVec2 a, b, c;
    switch (dir)
    {
    case ImGuiDir_Up:
    case ImGuiDir_Down:
        if (dir == ImGuiDir_Up) r = -r;
        center.y -= r * 0.25f;
        a = ImVec2(0,1) * r;
        b = ImVec2(-0.866f,-0.5f) * r;
        c = ImVec2(+0.866f,-0.5f) * r;
        break;
    case ImGuiDir_Left:
    case ImGuiDir_Right:
        if (dir == ImGuiDir_Left) r = -r;
        center.x -= r * 0.25f;
        a = ImVec2(1,0) * r;
        b = ImVec2(-0.500f,+0.866f) * r;
        c = ImVec2(-0.500f,-0.866f) * r;
        break;
    case ImGuiDir_None:
    case ImGuiDir_COUNT:
        IM_ASSERT(0);
        break;
    }

    window->DrawList->AddTriangleFilled(center + a, center + b, center + c, GetColorU32(ImGuiCol_Text));
}